

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O3

void __thiscall
SuiteTimeRangeTests::TestisInRangeWithDay_PastSundayOverlapSession::RunImpl
          (TestisInRangeWithDay_PastSundayOverlapSession *this)

{
  TestResults *pTVar1;
  char cVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_1c0;
  DateTime local_1a0;
  DateTime local_188;
  DateTime local_170;
  DateTime local_158;
  DateTime local_140;
  DateTime local_128;
  DateTime local_110;
  DateTime local_f8;
  DateTime local_e0;
  DateTime local_c8;
  DateTime local_b0;
  DateTime local_98;
  DateTime local_80;
  DateTime local_68;
  DateTime local_50;
  DateTime local_38;
  
  local_158._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_158.m_date = 0;
  local_158.m_time = 0;
  local_170._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_170.m_date = 0;
  local_170.m_time = 0x4e9455b43600;
  local_188._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_188.m_date = 0x2586c0;
  local_188.m_time = 1000000000;
  local_1a0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1a0.m_date = 0x2586c1;
  local_1a0.m_time = 30600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_158,&local_170,6,5,&local_188,&local_1a0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1c0,*ppTVar4,0xa3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_1c0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession1)"
              );
  }
  local_f8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_f8.m_date = 0;
  local_f8.m_time = 0;
  local_110._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_110.m_date = 0;
  local_110.m_time = 0x4e9455b43600;
  local_128._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_128.m_date = 0x2586c0;
  local_128.m_time = 1000000000;
  local_140._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_140.m_date = 0x2586c3;
  local_140.m_time = 30600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_f8,&local_110,6,5,&local_128,&local_140);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1c0,*ppTVar4,0xa7);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_1c0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession2)"
              );
  }
  local_98._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_98.m_date = 0;
  local_98.m_time = 0;
  local_b0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_b0.m_date = 0;
  local_b0.m_time = 0x4e9455b43600;
  local_c8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_c8.m_date = 0x2586c0;
  local_c8.m_time = 1000000000;
  local_e0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_e0.m_date = 0x2586c7;
  local_e0.m_time = 30600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_98,&local_b0,6,5,&local_c8,&local_e0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1c0,*ppTVar4,0xab);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_1c0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expNextSession)"
              );
  }
  local_38._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_38.m_date = 0;
  local_38.m_time = 0;
  local_50._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_50.m_date = 0;
  local_50.m_time = 0x4e9455b43600;
  local_68._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_68.m_date = 0x2586c0;
  local_68.m_time = 1000000000;
  local_80._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_80.m_date = 0x2586bf;
  local_80.m_time = 0x4e941a196c00;
  cVar2 = FIX::TimeRange::isInSameRange(&local_38,&local_50,6,5,&local_68,&local_80);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1c0,*ppTVar4,0xaf);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_1c0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expPrevSession)"
              );
  }
  return;
}

Assistant:

TEST(isInRangeWithDay_PastSundayOverlapSession)
{
    //Start Friday 00:00:00, end Thursday 23:59:59
    UtcTimeOnly startTime( 0, 0, 0 );
    UtcTimeOnly endTime( 23, 59, 59 );
    int startDay = 6;
    int endDay = 5;

    //Given creation happened on a Friday at 00:00:01, and a login the next day Saturday
    UtcTimeStamp creation( 0, 0, 1, 23, 4, 2021 );
    UtcTimeStamp expSameSession1( 8, 30, 0, 24, 4, 2021 );
    CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession1) );

    //Then a login request on a Monday at 08:30:00 should be part of the same session
    UtcTimeStamp expSameSession2( 8, 30, 0, 26, 4, 2021 );
    CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expSameSession2) );

    //But a login request on the following Friday at 08:30:00 should be part of a different session
    UtcTimeStamp expNextSession( 8, 30, 0, 30, 4, 2021 );
    CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expNextSession) );

    //And a login request on the preceding Thursday at 23:59:58 should be part of a different session
    UtcTimeStamp expPrevSession( 23, 59, 58, 22, 4, 2021 );
    CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, creation, expPrevSession) );
}